

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O0

bool __thiscall
SGParser::Parse<SGParser::Generator::StdGrammarStackElement>::Create
          (Parse<SGParser::Generator::StdGrammarStackElement> *this,ParseTable *ptable,
          size_t stackSize)

{
  undefined1 auVar1 [16];
  bool bVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  StdGrammarStackElement *pSVar5;
  StdGrammarStackElement *local_60;
  void *local_40;
  StdGrammarStackElement *local_38;
  StdGrammarStackElement *newStack;
  unsigned_long newStackSize;
  size_t stackSize_local;
  ParseTable *ptable_local;
  Parse<SGParser::Generator::StdGrammarStackElement> *this_local;
  
  newStackSize = stackSize;
  stackSize_local = (size_t)ptable;
  ptable_local = (ParseTable *)this;
  bVar2 = IsValid(this);
  if (bVar2) {
    this_local._7_1_ = false;
  }
  else {
    puVar3 = std::max<unsigned_long>(&MinStackSize,&newStackSize);
    pSVar5 = (StdGrammarStackElement *)*puVar3;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = pSVar5;
    uVar4 = SUB168(auVar1 * ZEXT816(0x38),0);
    if (SUB168(auVar1 * ZEXT816(0x38),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    newStack = pSVar5;
    local_38 = (StdGrammarStackElement *)operator_new__(uVar4);
    if (pSVar5 != (StdGrammarStackElement *)0x0) {
      local_60 = local_38;
      do {
        Generator::StdGrammarStackElement::StdGrammarStackElement(local_60);
        local_60 = local_60 + 1;
      } while (local_60 != local_38 + (long)pSVar5);
    }
    local_40 = (void *)0x0;
    puVar3 = std::exchange<unsigned_long*,decltype(nullptr)>
                       (&this->pValidTokenStackPositions,&local_40);
    if (puVar3 != (unsigned_long *)0x0) {
      operator_delete__(puVar3);
    }
    this->pParseTable = (ParseTable *)stackSize_local;
    this->pTokenizer = (TokenStream<SGParser::Generator::StdGrammarToken> *)0x0;
    this->TopState = 0xffffffff;
    this->ErrorMarker = 0xffffffffffffffff;
    pSVar5 = std::
             exchange<SGParser::Generator::StdGrammarStackElement*,SGParser::Generator::StdGrammarStackElement*&>
                       (&this->pStack,&local_38);
    if (pSVar5 != (StdGrammarStackElement *)0x0) {
      operator_delete__(pSVar5);
    }
    this->StackSize = (size_t)newStack;
    this->StackPosition = 0;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Parse<StackElement>::Create(const ParseTable* ptable, size_t stackSize) {
    // Make sure the parsing process is not started
    // IsValid() is reversed in this context: `this` is valid for Create
    // only if IsValid() is false
    if (IsValid())
        return false;

    // Allocate stack
    // Basic exception safety is provided
    const auto newStackSize = std::max(MinStackSize, stackSize);
    auto       newStack     = new StackElement[newStackSize];

    // From this point we can (safely) initialize the actual data

    delete[] std::exchange(pValidTokenStackPositions, nullptr);

    pParseTable = ptable;
    pTokenizer  = nullptr;
    TopState    = InvalidState;
    ErrorMarker = InvalidIndex;

    // If new stack allocation is successful then modify the existing stack
    delete[] std::exchange(pStack, newStack);
    StackSize     = newStackSize;
    StackPosition = 0u;

    return true;
}